

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
baseObject::drawParametricEquation
          (baseObject *this,_func_point_double *func,range *_rangeT,int cDivSteps)

{
  pointer *pp_Var1;
  pointer *ppbVar2;
  iterator __position;
  iterator __position_00;
  double dVar3;
  double dVar4;
  double dVar5;
  size_t i;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  point pVar11;
  point pt;
  bezierPoint dPoint;
  point local_d8;
  double local_c0;
  double local_b8;
  double dStack_b0;
  vector<bezierPoint,std::allocator<bezierPoint>> *local_a0;
  vector<_point,std::allocator<_point>> *local_98;
  double local_90;
  bezierPoint local_88;
  double local_58;
  double dStack_50;
  double local_48;
  
  local_90 = (_rangeT->max - _rangeT->min) / (double)cDivSteps;
  local_88.pt[2].x = 0.0;
  local_88.pt[2].y = 0.0;
  local_88.pt[1].x = 0.0;
  local_88.pt[1].y = 0.0;
  local_88.pt[0].x = 0.0;
  local_88.pt[0].y = 0.0;
  local_c0 = local_90 / 3.0;
  local_98 = (vector<_point,std::allocator<_point>> *)&this->points;
  local_a0 = (vector<bezierPoint,std::allocator<bezierPoint>> *)&this->curves;
  uVar6 = 0;
  do {
    auVar9._8_4_ = (int)(uVar6 >> 0x20);
    auVar9._0_8_ = uVar6;
    auVar9._12_4_ = 0x45300000;
    dStack_b0 = auVar9._8_8_ - 1.9342813113834067e+25;
    local_b8 = (dStack_b0 + ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) *
               local_90 + _rangeT->min;
    local_d8 = (*func)(local_b8);
    __position._M_current =
         (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<_point,std::allocator<_point>>::_M_realloc_insert<_point_const&>
                (local_98,__position,&local_d8);
    }
    else {
      (__position._M_current)->x = local_d8.x;
      (__position._M_current)->y = local_d8.y;
      pp_Var1 = &(this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *pp_Var1 = *pp_Var1 + 1;
    }
    dVar10 = (this->rangeX).min;
    dVar3 = (this->rangeX).max;
    dVar4 = (this->rangeY).min;
    dVar5 = (this->rangeY).max;
    uVar7 = -(ulong)(local_d8.x < dVar10);
    uVar8 = -(ulong)(dVar3 < local_d8.x);
    (this->rangeX).min = (double)(~uVar7 & (ulong)dVar10 | (ulong)local_d8.x & uVar7);
    (this->rangeX).max = (double)(~uVar8 & (ulong)dVar3 | (ulong)local_d8.x & uVar8);
    uVar7 = -(ulong)(local_d8.y < dVar4);
    uVar8 = -(ulong)(dVar5 < local_d8.y);
    dVar10 = (double)(~uVar8 & (ulong)dVar5 | (ulong)local_d8.y & uVar8);
    (this->rangeY).min = (double)(~uVar7 & (ulong)dVar4 | (ulong)local_d8.y & uVar7);
    (this->rangeY).max = dVar10;
    pVar11 = (*func)(local_b8 - local_c0);
    local_58 = pVar11.y;
    local_48 = pVar11.x;
    dStack_50 = dVar10;
    pVar11 = (*func)(local_b8 + local_c0);
    local_b8 = (pVar11.x - local_48) * 0.5;
    dStack_b0 = (pVar11.y - local_58) * 0.5;
    local_88.pt[1].x = local_d8.x - local_b8;
    local_88.pt[1].y = local_d8.y - dStack_b0;
    local_88.pt[2].x = local_d8.x;
    local_88.pt[2].y = local_d8.y;
    if (uVar6 != 0) {
      __position_00._M_current =
           (this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<bezierPoint,std::allocator<bezierPoint>>::_M_realloc_insert<bezierPoint_const&>
                  (local_a0,__position_00,&local_88);
      }
      else {
        (__position_00._M_current)->pt[2].x = local_d8.x;
        (__position_00._M_current)->pt[2].y = local_d8.y;
        (__position_00._M_current)->pt[1].x = local_88.pt[1].x;
        (__position_00._M_current)->pt[1].y = local_88.pt[1].y;
        (__position_00._M_current)->pt[0].x = local_88.pt[0].x;
        (__position_00._M_current)->pt[0].y = local_88.pt[0].y;
        ppbVar2 = &(this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppbVar2 = *ppbVar2 + 1;
      }
    }
    local_88.pt[0].x = local_b8 + local_d8.x;
    local_88.pt[0].y = dStack_b0 + local_d8.y;
    uVar6 = uVar6 + 1;
  } while (uVar6 <= (ulong)(long)cDivSteps);
  return;
}

Assistant:

void drawParametricEquation(point (*func)(double), const range& _rangeT, const int cDivSteps)
    {
        double cStep = _rangeT.getSpan() / cDivSteps;
        //rangeX = _rangeX;

        // for differentials
        bezierPoint dPoint;
        double dStep = cStep / 3.;

        for (size_t i = 0; i <= cDivSteps; i++)
        {
            double t = _rangeT.min + i * cStep;
            point pt = func(t);
            points.push_back(pt);

            // check the range of Y
            rangeX.min = pt.x < rangeX.min ? pt.x : rangeX.min;
            rangeX.max = pt.x > rangeX.max ? pt.x : rangeX.max;
            rangeY.min = pt.y < rangeY.min ? pt.y : rangeY.min;
            rangeY.max = pt.y > rangeY.max ? pt.y : rangeY.max;

            // compute differentials
            point diff[] = { func(t - dStep), func(t + dStep) };
            double slope = (diff[1].y - diff[0].y) / 2.;
            double xStep = (diff[1].x - diff[0].x) / 2.;
            dPoint.pt[1] = point(pt.x - xStep, pt.y - slope);
            dPoint.pt[2] = pt;
            if (i != 0)
            { // skip first iteration
                curves.push_back(dPoint);
            }
            dPoint.pt[0] = point(pt.x + xStep, pt.y + slope);
        }
    }